

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool GetTestPlane(ON_Curve *curve,ON_Plane *plane)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double t;
  ON_3dVector local_120;
  double local_108;
  double dot;
  ON_3dVector Y;
  undefined1 local_d0 [8];
  ON_3dPoint best_Y;
  double best_dot;
  double local_a8;
  double local_a0;
  undefined1 local_98 [8];
  ON_Interval d;
  ON_3dVector X;
  ON_3dPoint R;
  ON_3dPoint Q;
  ON_3dPoint P;
  int j;
  int i;
  ON_Plane *plane_local;
  ON_Curve *curve_local;
  
  (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  pdVar3 = ON_Interval::operator[]((ON_Interval *)local_98,0);
  bVar1 = ON_Curve::Ev1Der(curve,*pdVar3,(ON_3dPoint *)&Q.z,(ON_3dVector *)(d.m_t + 1),0,(int *)0x0)
  ;
  if ((bVar1) && (bVar1 = ON_3dVector::Unitize((ON_3dVector *)(d.m_t + 1)), bVar1)) {
    ON_3dPoint::operator+((ON_3dPoint *)&best_dot,(ON_3dPoint *)&Q.z,(ON_3dVector *)(d.m_t + 1));
    Q.x = local_a8;
    Q.y = local_a0;
    best_Y.z = 1.0;
    local_d0 = (undefined1  [8])ON_3dPoint::Origin.x;
    best_Y.x = ON_3dPoint::Origin.y;
    best_Y.y = ON_3dPoint::Origin.z;
    for (P.z._4_4_ = 2; P.z._4_4_ < 0x11; P.z._4_4_ = P.z._4_4_ + 2) {
      for (P.z._0_4_ = 1; P.z._0_4_ < P.z._4_4_; P.z._0_4_ = P.z._0_4_ + 2) {
        t = ON_Interval::ParameterAt((ON_Interval *)local_98,(double)P.z._0_4_ / (double)P.z._4_4_);
        ON_Curve::PointAt((ON_3dPoint *)&Y.z,curve,t);
        X.z = Y.z;
        ON_3dPoint::operator-((ON_3dVector *)&dot,(ON_3dPoint *)&X.z,(ON_3dPoint *)&Q.z);
        bVar1 = ON_3dVector::Unitize((ON_3dVector *)&dot);
        if (bVar1) {
          iVar2 = ON_3dVector::IsParallelTo
                            ((ON_3dVector *)(d.m_t + 1),(ON_3dVector *)&dot,0.017453292519943295);
          if (iVar2 == 0) {
            bVar1 = ON_Plane::CreateFromFrame
                              (plane,(ON_3dPoint *)&Q.z,(ON_3dVector *)(d.m_t + 1),
                               (ON_3dVector *)&dot);
            if (bVar1) {
              return true;
            }
          }
          else {
            local_108 = ON_3dVector::operator*((ON_3dVector *)(d.m_t + 1),(ON_3dVector *)&dot);
            local_108 = ABS(local_108);
            if (local_108 < best_Y.z) {
              ON_3dPoint::operator=((ON_3dPoint *)local_d0,(ON_3dVector *)&dot);
              best_Y.z = local_108;
            }
          }
        }
      }
    }
    if (best_Y.z < 1.0) {
      ON_3dVector::ON_3dVector(&local_120,(ON_3dPoint *)local_d0);
      bVar1 = ON_Plane::CreateFromFrame
                        (plane,(ON_3dPoint *)&Q.z,(ON_3dVector *)(d.m_t + 1),&local_120);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool GetTestPlane( const ON_Curve& curve, ON_Plane& plane )
{
  int i, j;
  ON_3dPoint P, Q, R;
  ON_3dVector X;
  ON_Interval d = curve.Domain();
  if ( !curve.Ev1Der( d[0], P, X ) )
  {
    return false;
  }
  if ( !X.Unitize() )
  {
    return false;
  }

  Q = P+X;
  double best_dot = 1.0;
  ON_3dPoint best_Y = ON_3dPoint::Origin;

  for ( i = 2; i <= 16; i += 2 )
  {
    for ( j = 1; j < i; j += 2 )
    {
      R = curve.PointAt( d.ParameterAt( ((double)j)/((double)i) ) );
      ON_3dVector Y = R - P;
      if (!Y.Unitize())
        continue;
      if (! X.IsParallelTo (Y)){
        if ( plane.CreateFromFrame( P, X, Y ) )
          return true;
      }
      else {
        double dot = fabs(X*Y);
        if (dot < best_dot){
          best_Y = Y;
          best_dot = dot;
        }
      }
    }
  }
  if (best_dot < 1.0){
    if ( plane.CreateFromFrame( P, X, best_Y ) )
      return true;
  }
  return false;
}